

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TraceBuffer::WriteChunkRecord
          (TraceBuffer *this,uint8_t *wptr,ChunkRecord *record,uint8_t *src,size_t size)

{
  code *pcVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  char *fname;
  uint *puVar4;
  char *pcVar5;
  int line;
  uint __errnum;
  char *pcVar6;
  
  puVar3 = (uint8_t *)((this->data_).p_ + this->size_);
  if ((ulong)((long)puVar3 - (long)this->wptr_) < (ulong)record->size) {
    fname = base::Basename(
                          "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                          );
    puVar4 = (uint *)__errno_location();
    __errnum = *puVar4;
    pcVar5 = strerror(__errnum);
    pcVar6 = "PERFETTO_CHECK(record.size <= size_to_end())";
    line = 0xc22f;
  }
  else {
    if (wptr + size + 0x10 <= puVar3) {
      uVar2 = *(undefined8 *)&record->num_fragments;
      *(undefined8 *)wptr = *(undefined8 *)record;
      *(undefined8 *)(wptr + 8) = uVar2;
      if (src != (uint8_t *)0x0) {
        memcpy(wptr + 0x10,src,size);
      }
      memset(wptr + size + 0x10,0,(record->size - size) - 0x10);
      return;
    }
    fname = base::Basename(
                          "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                          );
    puVar4 = (uint *)__errno_location();
    __errnum = *puVar4;
    pcVar5 = strerror(__errnum);
    pcVar6 = "PERFETTO_CHECK(wptr + sizeof(record) + size <= end())";
    line = 0xc236;
  }
  base::LogMessage(kLogError,fname,line,"%s (errno: %d, %s)",pcVar6,(ulong)__errnum,pcVar5);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void WriteChunkRecord(uint8_t* wptr,
                        const ChunkRecord& record,
                        const uint8_t* src,
                        size_t size) {
    // Note: |record.size| will be slightly bigger than |size| because of the
    // ChunkRecord header and rounding, to ensure that all ChunkRecord(s) are
    // multiple of sizeof(ChunkRecord). The invariant is:
    // record.size >= |size| + sizeof(ChunkRecord) (== if no rounding).
    PERFETTO_DCHECK(size <= ChunkRecord::kMaxSize);
    PERFETTO_DCHECK(record.size >= sizeof(record));
    PERFETTO_DCHECK(record.size % sizeof(record) == 0);
    PERFETTO_DCHECK(record.size >= size + sizeof(record));
    PERFETTO_CHECK(record.size <= size_to_end());
    DcheckIsAlignedAndWithinBounds(wptr);

    // We may be writing to this area for the first time.
    data_.EnsureCommitted(static_cast<size_t>(wptr + record.size - begin()));

    // Deliberately not a *D*CHECK.
    PERFETTO_CHECK(wptr + sizeof(record) + size <= end());
    memcpy(wptr, &record, sizeof(record));
    if (PERFETTO_LIKELY(src)) {
      // If the producer modifies the data in the shared memory buffer while we
      // are copying it to the central buffer, TSAN will (rightfully) flag that
      // as a race. However the entire purpose of copying the data into the
      // central buffer is that we can validate it without worrying that the
      // producer changes it from under our feet, so this race is benign. The
      // alternative would be to try computing which part of the buffer is safe
      // to read (assuming a well-behaving client), but the risk of introducing
      // a bug that way outweighs the benefit.
      PERFETTO_ANNOTATE_BENIGN_RACE_SIZED(
          src, size, "Benign race when copying chunk from shared memory.")
      memcpy(wptr + sizeof(record), src, size);
    } else {
      PERFETTO_DCHECK(size == record.size - sizeof(record));
    }
    const size_t rounding_size = record.size - sizeof(record) - size;
    memset(wptr + sizeof(record) + size, 0, rounding_size);
  }